

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void send_ssi_file(mg_connection *conn,char *path,mg_file *filep,int include_level)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int in_ssi_tag;
  int in_tag;
  int len;
  int ch;
  char buf [8192];
  int include_level_local;
  mg_file *filep_local;
  char *path_local;
  mg_connection *conn_local;
  
  buf._8188_4_ = include_level;
  if (include_level < 0xb) {
    in_ssi_tag = 0;
    bVar2 = false;
    bVar1 = false;
    do {
      while( true ) {
        while( true ) {
          iVar3 = mg_fgetc(filep);
          if (iVar3 == -1) {
            if (in_ssi_tag < 1) {
              return;
            }
            mg_write(conn,&len,(long)in_ssi_tag);
            return;
          }
          if (bVar1) break;
          if (iVar3 == 0x3c) {
            bVar1 = true;
            if (0 < in_ssi_tag) {
              mg_write(conn,&len,(long)in_ssi_tag);
            }
            in_ssi_tag = 1;
            len._0_1_ = 0x3c;
          }
          else {
            iVar4 = in_ssi_tag + 1;
            *(char *)((long)&len + (long)in_ssi_tag) = (char)iVar3;
            in_ssi_tag = iVar4;
            if (iVar4 == 0x2000) {
              mg_write(conn,&len,0x2000);
              in_ssi_tag = 0;
            }
          }
        }
        if (iVar3 != 0x3e) break;
        iVar3 = in_ssi_tag + 1;
        *(undefined1 *)((long)&len + (long)in_ssi_tag) = 0x3e;
        if (bVar2) {
          *(undefined1 *)((long)&len + (long)iVar3) = 0;
          if ((iVar3 < 0xd) || (iVar4 = memcmp((void *)((long)&ch + 1),"include",7), iVar4 != 0)) {
            if ((iVar3 < 10) || (stack0xffffffffffffdfdd != 0x63657865)) {
              mg_cry_internal_wrap
                        (conn,(mg_context *)0x0,"send_ssi_file",0x30ea,
                         "%s: unknown SSI command: \"%s\"",path,&len);
            }
            else {
              do_ssi_exec(conn,buf + 1);
            }
          }
          else {
            do_ssi_include(conn,path,buf + 4,buf._8188_4_ + 1);
          }
          bVar2 = false;
        }
        else {
          mg_write(conn,&len,(long)iVar3);
        }
        in_ssi_tag = 0;
        bVar1 = false;
      }
      *(char *)((long)&len + (long)in_ssi_tag) = (char)iVar3;
      if ((in_ssi_tag + 1 == 5) && (iVar3 = memcmp(&len,"<!--#",5), iVar3 == 0)) {
        bVar2 = true;
      }
      iVar3 = in_ssi_tag + 3;
      in_ssi_tag = in_ssi_tag + 1;
    } while (iVar3 < 0x2001);
    mg_cry_internal_wrap(conn,(mg_context *)0x0,"send_ssi_file",0x3102,"%s: tag is too large",path);
  }
  else {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,"send_ssi_file",0x30cb,"SSI #include level is too deep (%s)",
               path);
  }
  return;
}

Assistant:

static void
send_ssi_file(struct mg_connection *conn,
              const char *path,
              struct mg_file *filep,
              int include_level)
{
	char buf[MG_BUF_LEN];
	int ch, len, in_tag, in_ssi_tag;

	if (include_level > 10) {
		mg_cry_internal(conn, "SSI #include level is too deep (%s)", path);
		return;
	}

	in_tag = in_ssi_tag = len = 0;

	/* Read file, byte by byte, and look for SSI include tags */
	while ((ch = mg_fgetc(filep)) != EOF) {

		if (in_tag) {
			/* We are in a tag, either SSI tag or html tag */

			if (ch == '>') {
				/* Tag is closing */
				buf[len++] = '>';

				if (in_ssi_tag) {
					/* Handle SSI tag */
					buf[len] = 0;

					if ((len > 12) && !memcmp(buf + 5, "include", 7)) {
						do_ssi_include(conn, path, buf + 12, include_level + 1);
#if !defined(NO_POPEN)
					} else if ((len > 9) && !memcmp(buf + 5, "exec", 4)) {
						do_ssi_exec(conn, buf + 9);
#endif /* !NO_POPEN */
					} else {
						mg_cry_internal(conn,
						                "%s: unknown SSI "
						                "command: \"%s\"",
						                path,
						                buf);
					}
					len = 0;
					in_ssi_tag = in_tag = 0;

				} else {
					/* Not an SSI tag */
					/* Flush buffer */
					(void)mg_write(conn, buf, (size_t)len);
					len = 0;
					in_tag = 0;
				}

			} else {
				/* Tag is still open */
				buf[len++] = (char)(ch & 0xff);

				if ((len == 5) && !memcmp(buf, "<!--#", 5)) {
					/* All SSI tags start with <!--# */
					in_ssi_tag = 1;
				}

				if ((len + 2) > (int)sizeof(buf)) {
					/* Tag to long for buffer */
					mg_cry_internal(conn, "%s: tag is too large", path);
					return;
				}
			}

		} else {

			/* We are not in a tag yet. */
			if (ch == '<') {
				/* Tag is opening */
				in_tag = 1;

				if (len > 0) {
					/* Flush current buffer.
					 * Buffer is filled with "len" bytes. */
					(void)mg_write(conn, buf, (size_t)len);
				}
				/* Store the < */
				len = 1;
				buf[0] = '<';

			} else {
				/* No Tag */
				/* Add data to buffer */
				buf[len++] = (char)(ch & 0xff);
				/* Flush if buffer is full */
				if (len == (int)sizeof(buf)) {
					mg_write(conn, buf, (size_t)len);
					len = 0;
				}
			}
		}
	}

	/* Send the rest of buffered data */
	if (len > 0) {
		mg_write(conn, buf, (size_t)len);
	}
}